

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

void __thiscall UCAFL::_uc_setup(UCAFL *this)

{
  uint uVar1;
  int iVar2;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  uint32_t ver;
  uc_err err;
  UCAFL *this_local;
  
  uVar1 = uc_version(0);
  if (uVar1 < 0x2000100) {
    log(__x);
    exit(1);
  }
  iVar2 = uc_hook_add(this->uc_,&this->h1_,8,_uc_hook_block,this,1,0);
  if (iVar2 != 0) {
    log(__x_00);
    exit(1);
  }
  iVar2 = uc_hook_add(this->uc_,&this->h2_,0x8000,_uc_hook_new_tb,this,1,0);
  if (iVar2 != 0) {
    log(__x_01);
    exit(1);
  }
  if (((this->has_cmpcov_ & 1U) != 0) || ((this->has_cmplog_ & 1U) != 0)) {
    iVar2 = uc_hook_add(this->uc_,&this->h3_,0x10000,_uc_hook_sub,this,1,0,0,2);
    if (iVar2 != 0) {
      log(__x_02);
      exit(1);
    }
    iVar2 = uc_hook_add(this->uc_,&this->h4_,0x10000,_uc_hook_sub_cmp,this,1,0,0,1);
    if (iVar2 != 0) {
      log(__x_03);
      exit(1);
    }
  }
  return;
}

Assistant:

void _uc_setup() {
        uc_err err;
        uint32_t ver;

        ver = uc_version(NULL, NULL);

        // We need at least Unicorn 2.0.0rc5
        if (ver < MIN_UC_VERSION) {
            ERR("You Unicorn Version 0x%" PRIx32 " is not supported!\n", ver);
            exit(1);
        }

        // For coverage.
        err = uc_hook_add(this->uc_, &this->h1_, UC_HOOK_BLOCK,
                          (void*)_uc_hook_block, (void*)this, 1, 0);
        if (err) {
            ERR("Failed to setup block hook.\n");
            exit(1);
        }

        // For TB caching.
        err = uc_hook_add(this->uc_, &this->h2_, UC_HOOK_EDGE_GENERATED,
                          (void*)_uc_hook_new_tb, (void*)this, 1, 0);
        if (err) {
            ERR("Failed to setup new edge hook.\n");
            exit(1);
        }

        // If we should use Laf-Intel or Red-Queen do add CMP hooks
        if (this->has_cmpcov_ || this->has_cmplog_) {

            // These two hooks may not be supported by the arch.
            err = uc_hook_add(this->uc_, &this->h3_, UC_HOOK_TCG_OPCODE,
                            (void*)_uc_hook_sub, (void*)this, 1, 0, UC_TCG_OP_SUB,
                            UC_TCG_OP_FLAG_DIRECT);

            if (err) {
                ERR("Failed to setup UC_TCG_OP_SUB direct hook.\n");
                exit(1);
            }

            err = uc_hook_add(this->uc_, &this->h4_, UC_HOOK_TCG_OPCODE,
                            (void*)_uc_hook_sub_cmp, (void*)this, 1, 0,
                            UC_TCG_OP_SUB, UC_TCG_OP_FLAG_CMP);

            if (err) {
                ERR("Failed to setup UC_TCG_OP_SUB cmp hook.\n");
                exit(1);
            }
        }
    }